

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O1

QList<QByteArray> * __thiscall
QTzTimeZonePrivate::availableTimeZoneIds
          (QList<QByteArray> *__return_storage_ptr__,QTzTimeZonePrivate *this,Territory territory)

{
  byte bVar1;
  Entry *pEVar2;
  storage_type *psVar3;
  ulong uVar4;
  bool bVar5;
  Type *pTVar6;
  iterator iVar7;
  iterator iVar8;
  iterator iVar9;
  iterator iVar10;
  iterator iVar11;
  iterator iVar12;
  long lVar13;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_tzZones>_> *this_00;
  ulong uVar14;
  Data *pDVar15;
  iterator iVar16;
  long in_FS_OFFSET;
  QArrayDataPointer<QByteArray> local_98;
  QArrayDataPointer<QByteArray> local_78;
  QList<QByteArrayView> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QByteArray *)0x0;
  (__return_storage_ptr__->d).size = 0;
  this_00 = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_tzZones>_> *)
            __return_storage_ptr__;
  pTVar6 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_tzZones>_>::operator->
                     ((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_tzZones>_>
                       *)__return_storage_ptr__);
  pDVar15 = pTVar6->d;
  if (pDVar15 == (Data *)0x0) {
    pDVar15 = (Data *)0x0;
LAB_0040c58a:
    uVar14 = 0;
  }
  else {
    if (pDVar15->spans->offsets[0] != 0xff) goto LAB_0040c58a;
    uVar4 = 1;
    do {
      uVar14 = uVar4;
      if (pDVar15->numBuckets == uVar14) {
        pDVar15 = (Data *)0x0;
        uVar14 = 0;
        break;
      }
      this_00 = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_tzZones>_> *)
                (ulong)((uint)uVar14 & 0x7f);
      uVar4 = uVar14 + 1;
    } while (this_00[(long)(pDVar15->spans + (uVar14 >> 7))] ==
             (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_tzZones>_>)0xff);
  }
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_tzZones>_>::operator->(this_00);
  if (pDVar15 != (Data *)0x0 || uVar14 != 0) {
    do {
      pEVar2 = pDVar15->spans[uVar14 >> 7].entries;
      bVar1 = pDVar15->spans[uVar14 >> 7].offsets[(uint)uVar14 & 0x7f];
      if (*(Territory *)(pEVar2[bVar1].storage.data + 0x18) == territory) {
        QtPrivate::QMovableArrayOps<QByteArray>::emplace<QByteArray_const&>
                  ((QMovableArrayOps<QByteArray> *)__return_storage_ptr__,
                   (__return_storage_ptr__->d).size,(QByteArray *)(pEVar2 + bVar1));
        QList<QByteArray>::end(__return_storage_ptr__);
      }
      do {
        if (pDVar15->numBuckets - 1 == uVar14) {
          pDVar15 = (Data *)0x0;
          uVar14 = 0;
          break;
        }
        uVar14 = uVar14 + 1;
      } while (pDVar15->spans[uVar14 >> 7].offsets[(uint)uVar14 & 0x7f] == 0xff);
    } while ((pDVar15 != (Data *)0x0) || (uVar14 != 0));
  }
  iVar7 = QList<QByteArray>::begin(__return_storage_ptr__);
  iVar8 = QList<QByteArray>::end(__return_storage_ptr__);
  if (iVar7.i != iVar8.i) {
    uVar14 = ((long)iVar8.i - (long)iVar7.i >> 3) * -0x5555555555555555;
    lVar13 = 0x3f;
    if (uVar14 != 0) {
      for (; uVar14 >> lVar13 == 0; lVar13 = lVar13 + -1) {
      }
    }
    std::__introsort_loop<QList<QByteArray>::iterator,long_long,__gnu_cxx::__ops::_Iter_less_iter>
              (iVar7.i,iVar8.i,((uint)lVar13 ^ 0x3f) * 2 ^ 0x7e);
    std::__final_insertion_sort<QList<QByteArray>::iterator,__gnu_cxx::__ops::_Iter_less_iter>
              (iVar7.i,iVar8.i);
  }
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr = (QByteArrayView *)&DAT_aaaaaaaaaaaaaaaa;
  QTimeZonePrivate::matchingTimeZoneIds(&local_58,&this->super_QTimeZonePrivate,territory);
  iVar9 = QList<QByteArrayView>::begin(&local_58);
  iVar10 = QList<QByteArrayView>::end(&local_58);
  if (iVar9.i != iVar10.i) {
    uVar14 = (long)iVar10.i - (long)iVar9.i >> 4;
    lVar13 = 0x3f;
    if (uVar14 != 0) {
      for (; uVar14 >> lVar13 == 0; lVar13 = lVar13 + -1) {
      }
    }
    std::
    __introsort_loop<QList<QByteArrayView>::iterator,long_long,__gnu_cxx::__ops::_Iter_less_iter>
              (iVar9.i,iVar10.i,((uint)lVar13 ^ 0x3f) * 2 ^ 0x7e);
    std::__final_insertion_sort<QList<QByteArrayView>::iterator,__gnu_cxx::__ops::_Iter_less_iter>
              (iVar9.i,iVar10.i);
  }
  iVar9 = QList<QByteArrayView>::begin(&local_58);
  iVar10 = QList<QByteArrayView>::end(&local_58);
  iVar9 = std::__unique<QList<QByteArrayView>::iterator,__gnu_cxx::__ops::_Iter_equal_to_iter>
                    (iVar9.i,iVar10.i);
  iVar10 = QList<QByteArrayView>::begin(&local_58);
  local_98.d = (Data *)CONCAT62(local_98.d._2_6_,territory);
  local_78.d = (Data *)CONCAT62(local_78.d._2_6_,territory);
  lVar13 = (long)iVar9.i - (long)iVar10.i >> 6;
  if (0 < lVar13) {
    lVar13 = lVar13 + 1;
    do {
      bVar5 = __gnu_cxx::__ops::
              _Iter_pred<QTzTimeZonePrivate::availableTimeZoneIds(QLocale::Country)const::$_0>::
              operator()((_Iter_pred<QTzTimeZonePrivate::availableTimeZoneIds(QLocale::Country)const::__0>
                          *)&local_78,iVar10);
      iVar16.i = iVar10.i;
      if (bVar5) goto LAB_0040c810;
      bVar5 = __gnu_cxx::__ops::
              _Iter_pred<QTzTimeZonePrivate::availableTimeZoneIds(QLocale::Country)const::$_0>::
              operator()((_Iter_pred<QTzTimeZonePrivate::availableTimeZoneIds(QLocale::Country)const::__0>
                          *)&local_78,iVar10.i + 1);
      iVar16.i = iVar10.i + 1;
      if (bVar5) goto LAB_0040c810;
      bVar5 = __gnu_cxx::__ops::
              _Iter_pred<QTzTimeZonePrivate::availableTimeZoneIds(QLocale::Country)const::$_0>::
              operator()((_Iter_pred<QTzTimeZonePrivate::availableTimeZoneIds(QLocale::Country)const::__0>
                          *)&local_78,iVar10.i + 2);
      iVar16.i = iVar10.i + 2;
      if (bVar5) goto LAB_0040c810;
      bVar5 = __gnu_cxx::__ops::
              _Iter_pred<QTzTimeZonePrivate::availableTimeZoneIds(QLocale::Country)const::$_0>::
              operator()((_Iter_pred<QTzTimeZonePrivate::availableTimeZoneIds(QLocale::Country)const::__0>
                          *)&local_78,iVar10.i + 3);
      iVar16.i = iVar10.i + 3;
      if (bVar5) goto LAB_0040c810;
      iVar10.i = iVar10.i + 4;
      lVar13 = lVar13 + -1;
    } while (1 < lVar13);
  }
  lVar13 = (long)iVar9.i - (long)iVar10.i >> 4;
  if (lVar13 != 1) {
    if (lVar13 != 2) {
      iVar16 = iVar9;
      if ((lVar13 != 3) ||
         (bVar5 = __gnu_cxx::__ops::
                  _Iter_pred<QTzTimeZonePrivate::availableTimeZoneIds(QLocale::Country)const::$_0>::
                  operator()((_Iter_pred<QTzTimeZonePrivate::availableTimeZoneIds(QLocale::Country)const::__0>
                              *)&local_78,iVar10), iVar16.i = iVar10.i, bVar5)) goto LAB_0040c810;
      iVar10.i = iVar10.i + 1;
    }
    bVar5 = __gnu_cxx::__ops::
            _Iter_pred<QTzTimeZonePrivate::availableTimeZoneIds(QLocale::Country)const::$_0>::
            operator()((_Iter_pred<QTzTimeZonePrivate::availableTimeZoneIds(QLocale::Country)const::__0>
                        *)&local_78,iVar10);
    iVar16.i = iVar10.i;
    if (bVar5) goto LAB_0040c810;
    iVar10.i = iVar10.i + 1;
  }
  bVar5 = __gnu_cxx::__ops::
          _Iter_pred<QTzTimeZonePrivate::availableTimeZoneIds(QLocale::Country)const::$_0>::
          operator()((_Iter_pred<QTzTimeZonePrivate::availableTimeZoneIds(QLocale::Country)const::__0>
                      *)&local_78,iVar10);
  iVar16.i = iVar10.i;
  if (!bVar5) {
    iVar16 = iVar9;
  }
LAB_0040c810:
  iVar10.i = iVar16.i + 1;
  if (iVar10.i != iVar9.i && iVar16.i != iVar9.i) {
    do {
      bVar5 = __gnu_cxx::__ops::
              _Iter_pred<QTzTimeZonePrivate::availableTimeZoneIds(QLocale::Country)const::$_0>::
              operator()((_Iter_pred<QTzTimeZonePrivate::availableTimeZoneIds(QLocale::Country)const::__0>
                          *)&local_98,iVar10);
      if (!bVar5) {
        psVar3 = (iVar10.i)->m_data;
        (iVar16.i)->m_size = (iVar10.i)->m_size;
        (iVar16.i)->m_data = psVar3;
        iVar16.i = iVar16.i + 1;
      }
      iVar10.i = iVar10.i + 1;
    } while (iVar10.i != iVar9.i);
  }
  iVar9 = QList<QByteArrayView>::begin(&local_58);
  if ((long)iVar16.i - (long)iVar9.i != 0) {
    lVar13 = (long)iVar16.i - (long)iVar9.i >> 4;
    local_78.d = (Data *)0x0;
    local_78.ptr = (QByteArray *)0x0;
    local_78.size = 0;
    QList<QByteArray>::reserve((QList<QByteArray> *)&local_78,lVar13);
    iVar9 = QList<QByteArrayView>::begin(&local_58);
    if (iVar9.i != iVar16.i) {
      do {
        QByteArray::QByteArray((QByteArray *)&local_98,(iVar9.i)->m_data,(iVar9.i)->m_size);
        QtPrivate::QMovableArrayOps<QByteArray>::emplace<QByteArray>
                  ((QMovableArrayOps<QByteArray> *)&local_78,local_78.size,(QByteArray *)&local_98);
        QList<QByteArray>::end((QList<QByteArray> *)&local_78);
        if (&(local_98.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_98.d)->super_QArrayData,1,0x10);
          }
        }
        iVar9.i = iVar9.i + 1;
      } while (iVar9.i != iVar16.i);
    }
    local_98.d = (Data *)0x0;
    local_98.ptr = (QByteArray *)0x0;
    local_98.size = 0;
    QList<QByteArray>::reserve
              ((QList<QByteArray> *)&local_98,lVar13 + (__return_storage_ptr__->d).size);
    iVar7 = QList<QByteArray>::begin(__return_storage_ptr__);
    iVar8 = QList<QByteArray>::end(__return_storage_ptr__);
    iVar11 = QList<QByteArray>::begin((QList<QByteArray> *)&local_78);
    iVar12 = QList<QByteArray>::end((QList<QByteArray> *)&local_78);
    std::
    __set_union<QList<QByteArray>::iterator,QList<QByteArray>::iterator,std::back_insert_iterator<QList<QByteArray>>,__gnu_cxx::__ops::_Iter_less_iter>
              (iVar7.i,iVar8.i,iVar11.i,iVar12.i,&local_98);
    QArrayDataPointer<QByteArray>::operator=(&__return_storage_ptr__->d,&local_98);
    QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_98);
    QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_78);
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,0x10,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QList<QByteArray> QTzTimeZonePrivate::availableTimeZoneIds(QLocale::Territory territory) const
{
    QList<QByteArray> result;
    for (auto it = tzZones->cbegin(), end = tzZones->cend(); it != end; ++it) {
        if (it.value().territory == territory)
            result << it.key();
    }
    std::sort(result.begin(), result.end());

    // Since zone.tab only knows about one territory per zone, and is somewhat
    // incomplete, we may well miss some zones that CLDR associates with the
    // territory. So merge with those from CLDR that we do support.
    const auto unWantedZone = [territory](QByteArrayView id) {
        // We only want to add zones if they are known and we don't already have them:
        auto it = tzZones->constFind(id);
        return it == tzZones->end() || it->territory == territory;
    };
    QList<QByteArrayView> cldrViews = matchingTimeZoneIds(territory);
    std::sort(cldrViews.begin(), cldrViews.end());
    const auto uniqueEnd = std::unique(cldrViews.begin(), cldrViews.end());
    const auto prunedEnd = std::remove_if(cldrViews.begin(), uniqueEnd, unWantedZone);
    const auto cldrSize = std::distance(cldrViews.begin(), prunedEnd);
    if (cldrSize) {
        QList<QByteArray> cldrList;
        cldrList.reserve(cldrSize);
        for (auto it = cldrViews.begin(); it != prunedEnd; ++it)
            cldrList.emplace_back(it->toByteArray());
        QList<QByteArray> joined;
        joined.reserve(result.size() + cldrSize);
        std::set_union(result.begin(), result.end(), cldrList.begin(), cldrList.end(),
                       std::back_inserter(joined));
        result = joined;
    }

    return result;
}